

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

int net_tcp_set_linger(NETSOCKET sock,int state)

{
  long in_FS_OFFSET;
  linger linger_state;
  int local_18 [2];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18[1] = 0;
  local_18[0] = state;
  if (-1 < sock._0_8_) {
    setsockopt(sock.ipv4sock,1,0xd,local_18,8);
  }
  if (-1 < sock.ipv6sock) {
    setsockopt(sock.ipv6sock,1,0xd,local_18,8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

int net_tcp_set_linger(NETSOCKET sock, int state)
{
	struct linger linger_state;
	linger_state.l_onoff = state;
	linger_state.l_linger = 0;

	if(sock.ipv4sock >= 0)
	{
		/*	set linger	*/
		setsockopt(sock.ipv4sock, SOL_SOCKET, SO_LINGER, (const char*)&linger_state, sizeof(linger_state));
	}

	if(sock.ipv6sock >= 0)
	{
		/*	set linger	*/
		setsockopt(sock.ipv6sock, SOL_SOCKET, SO_LINGER, (const char*)&linger_state, sizeof(linger_state));
	}

	return 0;
}